

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O3

void * writer_thread_func(void *data)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (is_threads_working == 1) {
    iVar2 = 0;
    do {
      p_uthread_sleep(10);
      iVar1 = p_rwlock_writer_trylock(test_rwlock);
      if (iVar1 == 0) {
        iVar1 = p_rwlock_writer_lock(test_rwlock);
        if (iVar1 == 0) {
          p_uthread_exit(0xffffffff);
        }
      }
      string_buf[0x20] = '\0';
      string_buf[0x21] = '\0';
      string_buf[0x22] = '\0';
      string_buf[0x23] = '\0';
      string_buf[0x24] = '\0';
      string_buf[0x25] = '\0';
      string_buf[0x26] = '\0';
      string_buf[0x27] = '\0';
      string_buf[0x28] = '\0';
      string_buf[0x29] = '\0';
      string_buf[0x2a] = '\0';
      string_buf[0x2b] = '\0';
      string_buf[0x2c] = '\0';
      string_buf[0x2d] = '\0';
      string_buf[0x2e] = '\0';
      string_buf[0x2f] = '\0';
      string_buf[0x17] = '\0';
      string_buf[0x18] = '\0';
      string_buf[0x19] = '\0';
      string_buf[0x1a] = '\0';
      string_buf[0x1b] = '\0';
      string_buf[0x1c] = '\0';
      string_buf[0x1d] = '\0';
      string_buf[0x1e] = '\0';
      string_buf[0x1f] = '\0';
      string_buf[0x30] = '\0';
      string_buf[0x31] = '\0';
      if ((int)data == 1) {
        builtin_memcpy(string_buf,"This is a test string.",0x17);
      }
      else {
        builtin_memcpy(string_buf,"Ouh, yet another string to check!",0x22);
        string_buf[0x22] = '\0';
        string_buf[0x23] = '\0';
        string_buf[0x24] = '\0';
        string_buf[0x25] = '\0';
        string_buf[0x26] = '\0';
        string_buf[0x27] = '\0';
      }
      iVar1 = p_rwlock_writer_unlock(test_rwlock);
      if (iVar1 == 0) {
        p_uthread_exit(0xffffffff);
      }
      iVar2 = iVar2 + 1;
      p_atomic_int_inc(&writers_counter);
    } while (is_threads_working == 1);
  }
  p_uthread_exit(iVar2);
  return (void *)0x0;
}

Assistant:

static void * writer_thread_func (void *data)
{
	pint string_num = PPOINTER_TO_INT (data);
	pint counter    = 0;

	while (is_threads_working == TRUE) {
		p_uthread_sleep (10);

		if (p_rwlock_writer_trylock (test_rwlock) == FALSE) {
			if (p_rwlock_writer_lock (test_rwlock) == FALSE)
				p_uthread_exit (-1);
		}

		memset (string_buf, 0, sizeof (string_buf));

		if (string_num == 1)
			strcpy (string_buf, PRWLOCK_TEST_STRING_1);
		else
			strcpy (string_buf, PRWLOCK_TEST_STRING_2);

		if (p_rwlock_writer_unlock (test_rwlock) == FALSE)
			p_uthread_exit (-1);

		++counter;

		p_atomic_int_inc (&writers_counter);
	}

	p_uthread_exit (counter);

	return NULL;
}